

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCheckHeight(Parse *pParse,int nHeight)

{
  bool bVar1;
  
  bVar1 = pParse->db->aLimit[3] < nHeight;
  if (bVar1) {
    sqlite3ErrorMsg(pParse,"Expression tree is too large (maximum depth %d)");
  }
  return (uint)bVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCheckHeight(Parse *pParse, int nHeight){
  int rc = SQLITE_OK;
  int mxHeight = pParse->db->aLimit[SQLITE_LIMIT_EXPR_DEPTH];
  if( nHeight>mxHeight ){
    sqlite3ErrorMsg(pParse, 
       "Expression tree is too large (maximum depth %d)", mxHeight
    );
    rc = SQLITE_ERROR;
  }
  return rc;
}